

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O3

Result __thiscall
GetOpt::OptionPresent::operator()
          (OptionPresent *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags param_4)

{
  char cVar1;
  undefined1 uVar2;
  bool bVar3;
  Result RVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  
  p_Var8 = (short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_00104144:
    if ((this->long_opt)._M_string_length != 0) {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
              ::find(&long_ops->_M_t,&this->long_opt);
      if ((_Rb_tree_header *)iVar6._M_node != &(long_ops->_M_t)._M_impl.super__Rb_tree_header) {
        p_Var7 = iVar6._M_node + 2;
        goto LAB_0010416e;
      }
    }
    bVar3 = false;
  }
  else {
    p_Var9 = &(short_ops->_M_t)._M_impl.super__Rb_tree_header;
    cVar1 = this->short_opt;
    p_Var5 = &p_Var9->_M_header;
    do {
      uVar2 = (undefined1)p_Var8[1]._M_color;
      if (cVar1 <= (char)uVar2) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(char)uVar2 < cVar1];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var9) || (cVar1 < (char)p_Var5[1]._M_color))
    goto LAB_00104144;
    p_Var7 = (_Base_ptr)&p_Var5[1]._M_parent;
LAB_0010416e:
    p_Var7->_M_color = _S_black;
    bVar3 = true;
  }
  if (this->present == (bool *)0x0) {
    RVar4 = OptionNotFound_NoEx;
    if (bVar3 != false) {
      RVar4 = OK;
    }
  }
  else {
    *this->present = bVar3;
    RVar4 = OK;
  }
  return RVar4;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags /*flags*/) const
    {
        bool found;
        ShortOptions::iterator it = short_ops.find(short_opt);

        found = (it != short_ops.end());
        if (found)
        {
            it->second.flags = OptionData::CmdLine_Extracted;
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            found = (it != long_ops.end());
            if (found)
            {
                it->second.flags = OptionData::CmdLine_Extracted;
            }
        }

        if (present != NULL)
        {
            *present = found;
            return OK;
        }
        else
        {
            return found ? OK : OptionNotFound_NoEx;
        }
    }